

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmp.cxx
# Opt level: O2

void __thiscall vigra::BmpDecoder::~BmpDecoder(BmpDecoder *this)

{
  BmpDecoderImpl *this_00;
  
  (this->super_Decoder)._vptr_Decoder = (_func_int **)&PTR__BmpDecoder_00159730;
  this_00 = this->pimpl;
  if (this_00 != (BmpDecoderImpl *)0x0) {
    BmpDecoderImpl::~BmpDecoderImpl(this_00);
  }
  operator_delete(this_00);
  Decoder::~Decoder(&this->super_Decoder);
  return;
}

Assistant:

BmpDecoder::~BmpDecoder()
{
    delete pimpl;
}